

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

void __thiscall QString::QString(QString *this,char *ch)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView local_48;
  QArrayDataPointer<char16_t> local_38;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = ch;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_48,&local_20);
  QVar4.m_data = (storage_type *)local_48.m_size;
  QVar4.m_size = (qsizetype)&local_38;
  ::QString::fromUtf8(QVar4);
  qVar3 = local_38.size;
  pcVar2 = local_38.ptr;
  pDVar1 = local_38.d;
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  (this->d).d = pDVar1;
  (this->d).ptr = pcVar2;
  local_38.size = 0;
  (this->d).size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QT_ASCII_CAST_WARN inline QString(const char *ch)
        : QString(fromUtf8(ch))
    {}